

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O0

void __thiscall SM83::ill(SM83 *this,u8 opcode)

{
  text_style lhs;
  unsigned_short *in_R9;
  format_string<const_unsigned_char_&,_unsigned_short_&> fmt;
  color_type local_5c;
  text_style local_54;
  text_style local_40;
  text_style local_28;
  u8 local_11;
  SM83 *pSStack_10;
  u8 opcode_local;
  SM83 *this_local;
  
  local_11 = opcode;
  pSStack_10 = this;
  Bus::DumpMemoryToFile(this->bus);
  ::fmt::v11::text_style::text_style(&local_40,bold);
  ::fmt::v11::detail::color_type::color_type(&local_5c,fuchsia);
  ::fmt::v11::fg(&local_54,local_5c);
  lhs.background_color = local_40.background_color;
  lhs.foreground_color = local_40.foreground_color;
  lhs.set_foreground_color = local_40.set_foreground_color;
  lhs.set_background_color = local_40.set_background_color;
  lhs.ems = local_40.ems;
  lhs._19_1_ = local_40._19_1_;
  ::fmt::v11::operator|(&local_28,lhs,&local_54);
  fmt.str_.size_ = (size_t)&local_11;
  fmt.str_.data_ = (char *)0x2f;
  ::fmt::v11::print<unsigned_char_const&,unsigned_short&>
            ((v11 *)&local_28,(text_style *)"fatal: illegal opcode 0x{:02X} at 0x{:04X}\x1b[0m\n",
             fmt,(uchar *)&this->pc_at_opcode,in_R9);
  DumpRegisters(this);
  return;
}

Assistant:

void SM83::ill(const u8 opcode) {
    bus.DumpMemoryToFile();
    LFATAL("illegal opcode 0x{:02X} at 0x{:04X}", opcode, pc_at_opcode);
    DumpRegisters();
}